

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O1

int cmp_ok_at_loc(char *file,int line,int a,char *op,int b,char *fmt,...)

{
  char in_AL;
  int iVar1;
  uint uVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_108;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if ((op == "||") || ((op != (char *)0x0 && (iVar1 = strcmp(op,"||"), iVar1 == 0)))) {
    uVar2 = b | a;
  }
  else {
    if ((op == "&&") || ((op != (char *)0x0 && (iVar1 = strcmp(op,"&&"), iVar1 == 0)))) {
      uVar2 = (uint)(b != 0 && a != 0);
      goto LAB_00104b4e;
    }
    if ((op == "|") || ((op != (char *)0x0 && (iVar1 = strcmp(op,"|"), iVar1 == 0)))) {
      uVar2 = b | a;
      goto LAB_00104b4e;
    }
    if ((op == "^") || ((op != (char *)0x0 && (iVar1 = strcmp(op,"^"), iVar1 == 0)))) {
      uVar2 = b ^ a;
      goto LAB_00104b4e;
    }
    if ((op == "&") || ((op != (char *)0x0 && (iVar1 = strcmp(op,"&"), iVar1 == 0)))) {
      uVar2 = b & a;
      goto LAB_00104b4e;
    }
    if ((op == "==") || ((op != (char *)0x0 && (iVar1 = strcmp(op,"=="), iVar1 == 0)))) {
      uVar2 = (uint)(a == b);
      goto LAB_00104b4e;
    }
    if ((op != "!=") && ((op == (char *)0x0 || (iVar1 = strcmp(op,"!="), iVar1 != 0)))) {
      if ((op == "<") || ((op != (char *)0x0 && (iVar1 = strcmp(op,"<"), iVar1 == 0)))) {
        uVar2 = (uint)(a < b);
      }
      else if ((op == ">") || ((op != (char *)0x0 && (iVar1 = strcmp(op,">"), iVar1 == 0)))) {
        uVar2 = (uint)(b < a);
      }
      else if ((op == "<=") || ((op != (char *)0x0 && (iVar1 = strcmp(op,"<="), iVar1 == 0)))) {
        uVar2 = (uint)(a <= b);
      }
      else if ((op == ">=") || ((op != (char *)0x0 && (iVar1 = strcmp(op,">="), iVar1 == 0)))) {
        uVar2 = (uint)(b <= a);
      }
      else if ((op == "<<") || ((op != (char *)0x0 && (iVar1 = strcmp(op,"<<"), iVar1 == 0)))) {
        uVar2 = a << ((byte)b & 0x1f);
      }
      else if ((op == ">>") || ((op != (char *)0x0 && (iVar1 = strcmp(op,">>"), iVar1 == 0)))) {
        uVar2 = a >> ((byte)b & 0x1f);
      }
      else if ((op == "+") || ((op != (char *)0x0 && (iVar1 = strcmp(op,"+"), iVar1 == 0)))) {
        uVar2 = b + a;
      }
      else if ((op == "-") || ((op != (char *)0x0 && (iVar1 = strcmp(op,"-"), iVar1 == 0)))) {
        uVar2 = a - b;
      }
      else if ((op == "*") || ((op != (char *)0x0 && (iVar1 = strcmp(op,"*"), iVar1 == 0)))) {
        uVar2 = b * a;
      }
      else if ((op == "/") || ((op != (char *)0x0 && (iVar1 = strcmp(op,"/"), iVar1 == 0)))) {
        uVar2 = a / b;
      }
      else if ((op == "%") || ((op != (char *)0x0 && (iVar1 = strcmp(op,"%"), iVar1 == 0)))) {
        uVar2 = a % b;
      }
      else {
        uVar2 = 0;
        diag("unrecognized operator \'%s\'",op);
      }
      goto LAB_00104b4e;
    }
    uVar2 = a - b;
  }
  uVar2 = (uint)(uVar2 != 0);
LAB_00104b4e:
  local_108.reg_save_area = local_e8;
  local_108.overflow_arg_area = &stack0x00000008;
  local_108.gp_offset = 0x30;
  local_108.fp_offset = 0x30;
  vok_at_loc(file,line,uVar2,fmt,&local_108);
  if (uVar2 == 0) {
    diag("    %d",(ulong)(uint)a);
    diag("        %s",op);
    diag("    %d",b);
  }
  return uVar2;
}

Assistant:

int
cmp_ok_at_loc (const char *file, int line, int a, const char *op, int b,
               const char *fmt, ...)
{
    int test = eq(op, "||") ? a || b
             : eq(op, "&&") ? a && b
             : eq(op, "|")  ? a |  b
             : eq(op, "^")  ? a ^  b
             : eq(op, "&")  ? a &  b
             : eq(op, "==") ? a == b
             : eq(op, "!=") ? a != b
             : eq(op, "<")  ? a <  b
             : eq(op, ">")  ? a >  b
             : eq(op, "<=") ? a <= b
             : eq(op, ">=") ? a >= b
             : eq(op, "<<") ? a << b
             : eq(op, ">>") ? a >> b
             : eq(op, "+")  ? a +  b
             : eq(op, "-")  ? a -  b
             : eq(op, "*")  ? a *  b
             : eq(op, "/")  ? a /  b
             : eq(op, "%")  ? a %  b
             : diag("unrecognized operator '%s'", op);
    va_list args;
    va_start(args, fmt);
    vok_at_loc(file, line, test, fmt, args);
    va_end(args);
    if (!test) {
        diag("    %d", a);
        diag("        %s", op);
        diag("    %d", b);
    }
    return test;
}